

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractorValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)609>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Type *pTVar2;
  FeatureType *pFVar3;
  ArrayFeatureExtractor *pAVar4;
  Result *this;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *interface;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_a1;
  undefined1 local_a0 [40];
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_78;
  Result result;
  TypeCase local_34 [3];
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 0x261) {
    std::__cxx11::string::string
              ((string *)&result,"Model not an array feature extractor.",(allocator *)local_a0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
    this = &result;
    goto LAB_0020ae1e;
  }
  Result::Result(&result);
  validateModelDescription((Result *)local_a0,interface,format->specificationversion_);
  Result::operator=(&result,(Result *)local_a0);
  std::__cxx11::string::~string((string *)(local_a0 + 8));
  bVar1 = Result::good(&result);
  if (bVar1) {
    local_34[0] = 5;
    __l._M_len = 1;
    __l._M_array = local_34;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_78,__l,&local_a1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_a0,(CoreML *)&interface->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_78,
               in_R8);
    Result::operator=(&result,(Result *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_78);
    bVar1 = Result::good(&result);
    if (!bVar1) goto LAB_0020addf;
    local_34[0] = kDoubleType;
    local_34[1] = kInt64Type;
    local_34[2] = 5;
    __l_00._M_len = 3;
    __l_00._M_array = local_34;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_78,__l_00,&local_a1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_a0,(CoreML *)&interface->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_78,
               in_R8);
    Result::operator=(&result,(Result *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_78);
    bVar1 = Result::good(&result);
    if (!bVar1) goto LAB_0020addf;
    if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(interface->output_).super_RepeatedPtrFieldBase,0);
      pFVar3 = pTVar2->type_;
      if (pFVar3 == (FeatureType *)0x0) {
        pFVar3 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if (pFVar3->_oneof_case_[0] == 2) {
        pAVar4 = Specification::Model::arrayfeatureextractor(format);
        if ((pAVar4->extractindex_).current_size_ != 1) {
          std::__cxx11::string::string
                    ((string *)local_a0,
                     "If output type is Double in interface, exactly one extraction index must be specified."
                     ,(allocator *)&local_78);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
          goto LAB_0020ae5d;
        }
      }
      goto LAB_0020addf;
    }
    std::__cxx11::string::string
              ((string *)local_a0,"Exactly one input array column must be specified.",
               (allocator *)&local_78);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
LAB_0020ae5d:
    std::__cxx11::string::~string((string *)local_a0);
  }
  else {
LAB_0020addf:
    Result::Result(__return_storage_ptr__,&result);
  }
  this = (Result *)&result.m_message;
LAB_0020ae1e:
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_arrayFeatureExtractor>(const Specification::Model& format) {
        const auto& interface = format.description();
        
            // Make sure that if there is a double output type, there is exactly one output index selected.
        if(!format.has_arrayfeatureextractor()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an array feature extractor.");
        }
        

        Result result;
        
            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
            // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(),
                                                             1,
                                                             {Specification::FeatureType::kMultiArrayType
                                                             });
        if (!result.good()) {
            return result;
        }
        
            // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1,
                                                             {Specification::FeatureType::kDoubleType,
                                                                 Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kMultiArrayType});
        
        if (!result.good()) {
            return result;
        }
        
        if(interface.input().size() != 1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Exactly one input array column must be specified.");
        }
        
        if(interface.output(0).type().Type_case() == Specification::FeatureType::kDoubleType
           && format.arrayfeatureextractor().extractindex_size() != 1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If output type is Double in interface, exactly one extraction index must be specified.");
        }
        
        
            // TODO: check that the index is valid given the length of the input array.
            // auto index = format.arrayfeatureextractor().inputindex();
        
        return result;
    }